

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_routing.c
# Opt level: O1

void olsrv2_routing_force_update(_Bool skip_wait)

{
  nhdp_domain *domain;
  byte bVar1;
  uint pathcost;
  uint uVar2;
  undefined8 uVar3;
  _Bool _Var4;
  _Bool _Var5;
  int iVar6;
  list_entity *plVar7;
  list_entity *plVar8;
  list_entity *plVar9;
  netaddr *pnVar10;
  char *pcVar11;
  char *pcVar12;
  avl_tree *paVar13;
  long lVar14;
  long lVar15;
  list_entity **pplVar16;
  ulong uVar17;
  list_entity *plVar18;
  byte bVar19;
  os_route_str rbuf1;
  os_route_str local_192;
  
  bVar19 = 0;
  if ((_initiate_shutdown == '\0') && (!_freeze_routes)) {
    if (_rate_limit_timer._clock != 0) {
      if (!skip_wait) {
        _trigger_dijkstra = 1;
        if (((&log_global_mask)[LOG_OLSRV2_ROUTING] & 1) == 0) {
          _trigger_dijkstra = 1;
          return;
        }
        oonf_log(1,(ulong)LOG_OLSRV2_ROUTING,"src/olsrv2/olsrv2/olsrv2_routing.c",0x13e,0,0,
                 "Delay Dijkstra");
        return;
      }
      oonf_timer_stop(&_rate_limit_timer);
    }
    if (_update_ansn == true) {
      _ansn = _ansn + 1;
      _update_ansn = false;
      if (((&log_global_mask)[LOG_OLSRV2_ROUTING] & 1) != 0) {
        oonf_log(1,(ulong)LOG_OLSRV2_ROUTING,"src/olsrv2/olsrv2/olsrv2_routing.c",0x147,0,0,
                 "Update ANSN to %u",_ansn);
      }
    }
    if (((&log_global_mask)[LOG_OLSRV2_ROUTING] & 1) != 0) {
      oonf_log(1,(ulong)LOG_OLSRV2_ROUTING,"src/olsrv2/olsrv2/olsrv2_routing.c",0x14a,0,0,
               "Run Dijkstra");
    }
    plVar7 = nhdp_domain_get_list();
    plVar18 = plVar7->next;
    plVar7 = plVar18->prev;
    plVar8 = nhdp_domain_get_list();
    if (plVar7 != plVar8->prev) {
      do {
        iVar6 = *(int *)((long)&plVar18[-0x27].next + 4);
        if (_domain_changed[iVar6] == true) {
          _domain_changed[iVar6] = false;
          iVar6 = *(int *)((long)&plVar18[-0x27].next + 4);
          plVar7 = _routing_tree[iVar6].list_head.next;
          if (plVar7->prev != _routing_tree[iVar6].list_head.prev) {
            do {
              *(undefined1 *)((long)&plVar7[-8].prev + 3) = 0;
              pplVar16 = &plVar7[-0x17].prev;
              plVar8 = plVar7 + -7;
              for (lVar14 = 0xb; lVar14 != 0; lVar14 = lVar14 + -1) {
                plVar8->next = *pplVar16;
                pplVar16 = pplVar16 + (ulong)bVar19 * -2 + 1;
                plVar8 = (list_entity *)&plVar8[-(ulong)bVar19].prev;
              }
              *(undefined4 *)&plVar7[-2].prev = *(undefined4 *)&plVar7[-0x11].next;
              plVar7 = plVar7->next;
            } while (plVar7->prev !=
                     _routing_tree[*(int *)((long)&plVar18[-0x27].next + 4)].list_head.prev);
          }
          domain = (nhdp_domain *)(plVar18 + -0x2a);
          _prepare_nodes();
          _Var4 = _check_ssnode_split(domain,2);
          _run_dijkstra(domain,2,true,!_Var4);
          _Var5 = _check_ssnode_split(domain,10);
          _run_dijkstra(domain,10,true,!_Var5);
          if (_Var4 || _Var5) {
            _prepare_nodes();
            if (_Var4) {
              _run_dijkstra(domain,2,false,true);
            }
            if (_Var5) {
              _run_dijkstra(domain,10,false,true);
            }
          }
          plVar7 = nhdp_db_get_neigh_list();
          for (plVar7 = plVar7->next; plVar8 = plVar7->prev, plVar9 = nhdp_db_get_neigh_list(),
              plVar8 != plVar9->prev; plVar7 = plVar7->next) {
            if ((*(int *)((long)&plVar7[-9].prev + 4) != 0) &&
               (pathcost = *(uint *)((long)&plVar7[(long)*(int *)((long)&plVar18[-0x27].next + 4) *
                                                   2 + 4].prev + 4), pathcost < 0xffff01)) {
              pplVar16 = &plVar7[-10].prev;
              plVar8 = plVar7[-5].next;
              if (plVar8->prev != plVar7[-5].prev) {
                bVar1 = *(byte *)&plVar7[-9].prev;
                do {
                  _Var4 = olsrv2_is_nhdp_routable((netaddr *)&plVar8[-9].prev);
                  if (_Var4) {
                    pnVar10 = olsrv2_originator_get((uint)bVar1);
                    if (pnVar10 == (netaddr *)0x0) {
                      pnVar10 = (netaddr *)&NETADDR_UNSPEC;
                    }
                    os_routing_generic_init_half_os_route_key
                              ((netaddr *)(rbuf1.buf + 0x12),(netaddr *)&rbuf1,
                               (netaddr *)&plVar8[-9].prev);
                    _update_routing_entry
                              (domain,(os_route_key *)&rbuf1,pnVar10,(nhdp_neighbor *)pplVar16,'\0',
                               pathcost,'\x01',true,pnVar10);
                  }
                  plVar8 = plVar8->next;
                } while (plVar8->prev != plVar7[-5].prev);
              }
              plVar8 = plVar7[-6].next;
              if (plVar8->prev != plVar7[-6].prev) {
                do {
                  for (plVar9 = plVar8[-5].prev; plVar9->prev != plVar8[-4].next;
                      plVar9 = plVar9->next) {
                    if ((plVar9[-1].prev == (list_entity *)0x0) &&
                       (uVar2 = *(uint *)((long)&plVar9[7].next +
                                         (long)*(int *)((long)&plVar18[-0x27].next + 4) * 0xc + 4),
                       uVar2 < 0xffff01)) {
                      os_routing_generic_init_half_os_route_key
                                ((netaddr *)(rbuf1.buf + 0x12),(netaddr *)&rbuf1,
                                 (netaddr *)(plVar9 + -8));
                      _update_routing_entry
                                (domain,(os_route_key *)&rbuf1,(netaddr *)&NETADDR_UNSPEC,
                                 (nhdp_neighbor *)pplVar16,'\0',uVar2 + pathcost,'\x02',false,
                                 (netaddr *)pplVar16);
                    }
                  }
                  plVar8 = plVar8->next;
                } while (plVar8->prev != plVar7[-6].prev);
              }
            }
          }
          iVar6 = *(int *)((long)&plVar18[-0x27].next + 4);
          plVar7 = _routing_tree[iVar6].list_head.next;
          if (plVar7->prev != _routing_tree[iVar6].list_head.prev) {
            do {
              plVar8 = plVar7[-0xc].prev;
              *(char *)((long)&plVar7[-0x12].prev + 4) =
                   (char)_domain_parameter[*(int *)((long)&plVar8[3].next + 4)].table;
              *(char *)((long)&plVar7[-0x12].prev + 5) =
                   (char)_domain_parameter[*(int *)((long)&plVar8[3].next + 4)].protocol;
              *(int *)&plVar7[-0x12].prev =
                   _domain_parameter[*(int *)((long)&plVar8[3].next + 4)].distance;
              if (((*(char *)((long)&plVar7[-8].prev + 3) == '\x01') &&
                  (_domain_parameter[*(int *)((long)&plVar8[3].next + 4)].use_srcip_in_routes ==
                   true)) && (*(char *)&plVar7[-0x15].next == '\x02')) {
                pnVar10 = olsrv2_originator_get(2);
                uVar3 = *(undefined8 *)(pnVar10->_addr + 8);
                *(undefined8 *)((long)&plVar7[-0x13].next + 6) = *(undefined8 *)pnVar10->_addr;
                *(undefined8 *)((long)&plVar7[-0x13].prev + 6) = uVar3;
                *(undefined2 *)((long)&plVar7[-0x12].next + 6) = *(undefined2 *)&pnVar10->_type;
              }
              paVar13 = olsrv2_lan_get_tree();
              lVar14 = avl_find(paVar13,plVar7 + -0x16);
              if (((lVar14 != 0) &&
                  (lVar15 = (long)*(int *)((long)&plVar18[-0x27].next + 4),
                  *(char *)(lVar14 + 0x41 + lVar15 * 8) == '\x01')) &&
                 (*(uint *)(lVar14 + 0x3c + lVar15 * 8) < *(uint *)&plVar7[-0xb].next)) {
                *(undefined1 *)((long)&plVar7[-8].prev + 3) = 0;
              }
              pplVar16 = &plVar7[-0x17].prev;
              for (plVar8 = _routing_filter_list.next; plVar8->prev != _routing_filter_list.prev;
                  plVar8 = plVar8->next) {
                (*(code *)plVar8[-1].prev)
                          (domain,pplVar16,*(undefined1 *)((long)&plVar7[-8].prev + 3));
              }
              if (*(char *)((long)&plVar7[-8].prev + 3) == '\x01') {
                iVar6 = bcmp((os_route_parameter *)(plVar7 + -7),pplVar16,0x5c);
                if (iVar6 != 0) goto LAB_001338c1;
                uVar17 = (ulong)LOG_OLSRV2_ROUTING;
                if (((&log_global_mask)[uVar17] & 2) != 0) {
                  pcVar11 = os_routing_generic_rt_to_string
                                      (&rbuf1,(os_route_parameter *)(plVar7 + -7));
                  pcVar12 = os_routing_generic_rt_to_string
                                      (&local_192,(os_route_parameter *)pplVar16);
                  oonf_log(2,uVar17,"src/olsrv2/olsrv2/olsrv2_routing.c",0x446,0,0,
                           "Ignore route change: %s -> %s",pcVar11,pcVar12);
                }
              }
              else {
LAB_001338c1:
                _add_route_to_kernel_queue((olsrv2_routing_entry *)pplVar16);
              }
              plVar7 = plVar7->next;
            } while (plVar7->prev !=
                     _routing_tree[*(int *)((long)&plVar18[-0x27].next + 4)].list_head.prev);
          }
        }
        plVar18 = plVar18->next;
        plVar7 = plVar18->prev;
        plVar8 = nhdp_domain_get_list();
      } while (plVar7 != plVar8->prev);
    }
    _process_kernel_queue();
    oonf_timer_set_ext(&_rate_limit_timer,1000,1000);
  }
  return;
}

Assistant:

void
olsrv2_routing_force_update(bool skip_wait) {
  struct nhdp_domain *domain;
  bool splitv4, splitv6;

  if (_initiate_shutdown || _freeze_routes) {
    /* no dijkstra anymore when in shutdown */
    return;
  }

  /* handle dijkstra rate limitation timer */
  if (oonf_timer_is_active(&_rate_limit_timer)) {
    if (!skip_wait) {
      /* trigger dijkstra later */
      _trigger_dijkstra = true;

      OONF_DEBUG(LOG_OLSRV2_ROUTING, "Delay Dijkstra");
      return;
    }
    oonf_timer_stop(&_rate_limit_timer);
  }

  if (_update_ansn) {
    _ansn++;
    _update_ansn = false;
    OONF_DEBUG(LOG_OLSRV2_ROUTING, "Update ANSN to %u", _ansn);
  }

  OONF_DEBUG(LOG_OLSRV2_ROUTING, "Run Dijkstra");

  list_for_each_element(nhdp_domain_get_list(), domain, _node) {
    /* check if dijkstra is necessary */
    if (!_domain_changed[domain->index]) {
      /* nothing to do for this domain */
      continue;
    }
    _domain_changed[domain->index] = false;

    /* initialize dijkstra specific fields */
    _prepare_routes(domain);
    _prepare_nodes();

    /* run IPv4 dijkstra (might be two times because of source-specific data) */
    splitv4 = _check_ssnode_split(domain, AF_INET);
    _run_dijkstra(domain, AF_INET, true, !splitv4);

    /* run IPv6 dijkstra (might be two times because of source-specific data) */
    splitv6 = _check_ssnode_split(domain, AF_INET6);
    _run_dijkstra(domain, AF_INET6, true, !splitv6);

    /* handle source-specific sub-topology if necessary */
    if (splitv4 || splitv6) {
      /* re-initialize dijkstra specific node fields */
      _prepare_nodes();

      if (splitv4) {
        _run_dijkstra(domain, AF_INET, false, true);
      }
      if (splitv6) {
        _run_dijkstra(domain, AF_INET6, false, true);
      }
    }

    /* check if direct one-hop routes are quicker */
    _handle_nhdp_routes(domain);

    /* update kernel routes */
    _process_dijkstra_result(domain);
  }

  _process_kernel_queue();

  /* make sure dijkstra is not called too often */
  oonf_timer_set(&_rate_limit_timer, OLSRv2_DIJKSTRA_RATE_LIMITATION);
}